

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O0

void __thiscall
icu_63::RuleBasedCollator::internalGetContractionsAndExpansions
          (RuleBasedCollator *this,UnicodeSet *contractions,UnicodeSet *expansions,UBool addPrefixes
          ,UErrorCode *errorCode)

{
  UBool UVar1;
  ContractionsAndExpansions local_250;
  UErrorCode *local_30;
  UErrorCode *errorCode_local;
  UnicodeSet *pUStack_20;
  UBool addPrefixes_local;
  UnicodeSet *expansions_local;
  UnicodeSet *contractions_local;
  RuleBasedCollator *this_local;
  
  local_30 = errorCode;
  errorCode_local._7_1_ = addPrefixes;
  pUStack_20 = expansions;
  expansions_local = contractions;
  contractions_local = (UnicodeSet *)this;
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    if (expansions_local != (UnicodeSet *)0x0) {
      UnicodeSet::clear(expansions_local);
    }
    if (pUStack_20 != (UnicodeSet *)0x0) {
      UnicodeSet::clear(pUStack_20);
    }
    ContractionsAndExpansions::ContractionsAndExpansions
              (&local_250,expansions_local,pUStack_20,(CESink *)0x0,errorCode_local._7_1_);
    ContractionsAndExpansions::forData(&local_250,this->data,local_30);
    ContractionsAndExpansions::~ContractionsAndExpansions(&local_250);
  }
  return;
}

Assistant:

void
RuleBasedCollator::internalGetContractionsAndExpansions(
        UnicodeSet *contractions, UnicodeSet *expansions,
        UBool addPrefixes, UErrorCode &errorCode) const {
    if(U_FAILURE(errorCode)) { return; }
    if(contractions != NULL) {
        contractions->clear();
    }
    if(expansions != NULL) {
        expansions->clear();
    }
    ContractionsAndExpansions(contractions, expansions, NULL, addPrefixes).forData(data, errorCode);
}